

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  Expression *args;
  ReturnValue *pRVar1;
  
  this_00 = this->newModule;
  args = cloneExpression(this,*(Expression **)(__fn + 0x18));
  pRVar1 = Module::allocate<soul::heart::ReturnValue,soul::heart::Expression&>(this_00,args);
  return (int)pRVar1;
}

Assistant:

heart::ReturnValue& clone (const heart::ReturnValue& old)
    {
        return newModule.allocate<heart::ReturnValue> (cloneExpression (old.returnValue));
    }